

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-utils.h
# Opt level: O1

double tour_eval(Instance *instance,Tour *tour)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  double dVar6;
  double local_38;
  double local_30;
  double local_28;
  
  if (tour->num_comps != 1) {
    return INFINITY;
  }
  uVar1 = tour->num_customers;
  if (-1 < (long)(int)uVar1) {
    uVar2 = uVar1 >> 0x1f;
    uVar5 = 0;
    do {
      if ((-1 < tour->succ[uVar5]) && (((int)uVar1 < tour->succ[uVar5] || (tour->comp[uVar5] != 0)))
         ) {
        if (uVar2 == 0) {
          return INFINITY;
        }
        break;
      }
      bVar4 = (ulong)(long)(int)uVar1 <= uVar5;
      uVar5 = uVar5 + 1;
      uVar2 = (uint)bVar4;
    } while (uVar1 + 1 != uVar5);
  }
  if (-1 < tour->num_customers) {
    local_30 = *instance->demands + 0.0;
    local_28 = 0.0;
    local_38 = *instance->profits + 0.0;
    uVar5 = 0;
    do {
      uVar2 = (uint)uVar5;
      uVar1 = tour->succ[uVar5];
      lVar3 = (long)(int)uVar1;
      if (lVar3 == 0) {
        dVar6 = cptp_dist(instance,uVar2,0);
        uVar5 = -(ulong)(instance->vehicle_cap < local_30);
        return (double)(uVar5 & 0x7ff0000000000000 | ~uVar5 & (ulong)((local_28 + dVar6) - local_38)
                       );
      }
      if (uVar1 == uVar2) {
        __assert_fail("next_vertex != curr_vertex",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                      ,0x80,"double tour_eval(const Instance *, Tour *)");
      }
      dVar6 = cptp_dist(instance,uVar2,uVar1);
      if ((int)uVar1 < 0) break;
      local_38 = local_38 + instance->profits[lVar3];
      local_30 = local_30 + instance->demands[lVar3];
      local_28 = local_28 + dVar6;
      uVar5 = (ulong)uVar1;
    } while ((int)uVar1 <= tour->num_customers);
  }
  __assert_fail("idx >= 0 && idx < len",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/types.h"
                ,0x6c,"int32_t *veci32_access(int32_t *, int32_t, int32_t)");
}

Assistant:

static inline double tour_eval(const Instance *instance, Tour *tour) {
    if (tour->num_comps != 1) {
        return INFINITY;
    }

    for (int32_t i = 0; i < tour->num_customers + 1; i++) {
        int32_t succ = *tsucc(tour, i);
        if (succ >= 0) {
            if (*tcomp(tour, i) != 0 || succ >= tour->num_customers + 1) {
                return INFINITY;
            }
        }
    }

    double cost = 0.0;
    double profit = 0.0;
    double demands = 0.0;

    int32_t curr_vertex = 0;
    int32_t next_vertex = -1;

    profit += instance->profits[0];
    demands += instance->demands[0];

    while ((next_vertex = *tsucc(tour, curr_vertex)) != 0) {
        assert(next_vertex != curr_vertex);
        cost += cptp_dist(instance, curr_vertex, next_vertex);
        profit += instance->profits[next_vertex];
        demands += instance->demands[next_vertex];
        curr_vertex = next_vertex;
    }

    cost += cptp_dist(instance, curr_vertex, 0);

    if (demands > instance->vehicle_cap) {
        return INFINITY;
    } else {
        return cost - profit;
    }
}